

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

bool ggml_graph_compute_helper(ggml_backend_sched_t sched,ggml_cgraph *graph,int n_threads)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  code *pcVar6;
  
  iVar1 = ggml_backend_sched_get_n_backends();
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      uVar3 = ggml_backend_sched_get_backend(sched,iVar1);
      lVar4 = ggml_backend_get_device(uVar3);
      if (lVar4 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = ggml_backend_dev_backend_reg(lVar4);
      }
      pcVar6 = (code *)ggml_backend_reg_get_proc_address(uVar5,"ggml_backend_set_n_threads");
      if (pcVar6 != (code *)0x0) {
        (*pcVar6)(uVar3,n_threads);
      }
      iVar1 = iVar1 + 1;
      iVar2 = ggml_backend_sched_get_n_backends(sched);
    } while (iVar1 < iVar2);
  }
  iVar1 = ggml_backend_sched_graph_compute(sched,graph);
  ggml_backend_sched_reset(sched);
  return iVar1 == 0;
}

Assistant:

static bool ggml_graph_compute_helper(
      ggml_backend_sched_t   sched,
        struct ggml_cgraph * graph,
                       int   n_threads) {

    for (int i = 0; i < ggml_backend_sched_get_n_backends(sched); ++i) {
        ggml_backend_t backend = ggml_backend_sched_get_backend(sched, i);
        ggml_backend_dev_t dev = ggml_backend_get_device(backend);
        ggml_backend_reg_t reg = dev ? ggml_backend_dev_backend_reg(dev) : nullptr;

        auto * fn_set_n_threads = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
        if (fn_set_n_threads) {
            fn_set_n_threads(backend, n_threads);
        }
    }

    bool t = ggml_backend_sched_graph_compute(sched, graph) == GGML_STATUS_SUCCESS;
    ggml_backend_sched_reset(sched);
    return t;
}